

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O0

void WebPRescalerImportRowShrink_C(WebPRescaler *wrk,uint8_t *src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  rescaler_t frac;
  uint32_t base;
  int accum;
  uint32_t sum;
  int x_out;
  int x_in;
  int channel;
  int x_out_max;
  int x_stride;
  uint8_t *src_local;
  WebPRescaler *wrk_local;
  
  iVar1 = wrk->num_channels;
  iVar2 = wrk->dst_width;
  iVar3 = wrk->num_channels;
  for (channel = 0; channel < iVar1; channel = channel + 1) {
    x_in = channel;
    sum = 0;
    accum = 0;
    for (x_out = channel; x_out < iVar2 * iVar3; x_out = iVar1 + x_out) {
      base = 0;
      for (accum = wrk->x_add + accum; 0 < accum; accum = accum - wrk->x_sub) {
        base = (uint32_t)src[x_in];
        sum = base + sum;
        x_in = iVar1 + x_in;
      }
      wrk->frow[x_out] = sum * wrk->x_sub - base * -accum;
      sum = (uint32_t)((ulong)(base * -accum) * (ulong)wrk->fx_scale + 0x80000000 >> 0x20);
    }
  }
  return;
}

Assistant:

void WebPRescalerImportRowShrink_C(WebPRescaler* WEBP_RESTRICT const wrk,
                                   const uint8_t* WEBP_RESTRICT src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(!wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    uint32_t sum = 0;
    int accum = 0;
    while (x_out < x_out_max) {
      uint32_t base = 0;
      accum += wrk->x_add;
      while (accum > 0) {
        accum -= wrk->x_sub;
        assert(x_in < wrk->src_width * x_stride);
        base = src[x_in];
        sum += base;
        x_in += x_stride;
      }
      {        // Emit next horizontal pixel.
        const rescaler_t frac = base * (-accum);
        wrk->frow[x_out] = sum * wrk->x_sub - frac;
        // fresh fractional start for next pixel
        sum = (int)MULT_FIX(frac, wrk->fx_scale);
      }
      x_out += x_stride;
    }
    assert(accum == 0);
  }
}